

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page.c
# Opt level: O0

mi_page_t * mi_find_page(mi_heap_t *heap,size_t size,size_t huge_alignment)

{
  long in_RDX;
  mi_heap_t *in_RSI;
  size_t unaff_retaddr;
  size_t in_stack_00000008;
  size_t req_size;
  undefined7 in_stack_ffffffffffffffd0;
  mi_page_t *local_8;
  
  if ((mi_heap_t *)0x10000 < in_RSI || in_RDX != 0) {
    if (in_RSI < (mi_heap_t *)0xfffffffe0001) {
      local_8 = mi_large_huge_page_alloc((mi_heap_t *)req_size,in_stack_00000008,unaff_retaddr);
    }
    else {
      _mi_error_message(0x4b,"allocation request is too large (%zu bytes)\n",in_RSI);
      local_8 = (mi_page_t *)0x0;
    }
  }
  else {
    local_8 = mi_find_free_page(in_RSI,CONCAT17((mi_heap_t *)0x10000 < in_RSI || in_RDX != 0,
                                                in_stack_ffffffffffffffd0));
  }
  return local_8;
}

Assistant:

static mi_page_t* mi_find_page(mi_heap_t* heap, size_t size, size_t huge_alignment) mi_attr_noexcept {
  // huge allocation?
  const size_t req_size = size - MI_PADDING_SIZE;  // correct for padding_size in case of an overflow on `size`
  if mi_unlikely(req_size > (MI_MEDIUM_OBJ_SIZE_MAX - MI_PADDING_SIZE) || huge_alignment > 0) {
    if mi_unlikely(req_size > MI_MAX_ALLOC_SIZE) {
      _mi_error_message(EOVERFLOW, "allocation request is too large (%zu bytes)\n", req_size);
      return NULL;
    }